

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ObjSetPhase(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  uVar1 = *(ulong *)pObj;
  uVar8 = (uint)uVar1;
  uVar9 = uVar1 & 0x1fffffff;
  if (uVar9 == 0x1fffffff || (int)uVar8 < 0) {
    if (-1 < (int)uVar8 || (int)uVar9 == 0x1fffffff) {
      uVar9 = uVar1 & 0x7fffffffffffffff;
      goto LAB_0073d7b2;
    }
    uVar7 = (uVar1 << 0x22 ^ *(ulong *)(pObj + -uVar9)) & 0x8000000000000000;
    uVar9 = uVar1 & 0x7fffffffffffffff;
  }
  else {
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar5 = (uint)(uVar1 >> 0x1d) & 1;
    uVar6 = (uint)(uVar1 >> 0x20);
    uVar4 = uVar6 >> 0x1d & 1;
    puVar3 = p->pMuxes;
    uVar10 = -(int)((long)*(undefined8 *)(pObj + -uVar9) >> 0x3f);
    uVar11 = -(int)((long)*(undefined8 *)(pObj + -(ulong)(uVar6 & 0x1fffffff)) >> 0x3f);
    if ((puVar3 != (uint *)0x0) &&
       (iVar12 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2), puVar3[iVar12 * -0x55555555] != 0))
    {
      if ((int)puVar3[iVar12 * -0x55555555] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar8 = puVar3[iVar12 * -0x55555555] >> 1;
      if (p->nObjs <= (int)uVar8) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (puVar3 == (uint *)0x0) {
        uVar6 = 0;
      }
      else {
        if ((int)puVar3[iVar12 * -0x55555555] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10d,"int Abc_LitIsCompl(int)");
        }
        uVar6 = puVar3[iVar12 * -0x55555555] & 1;
      }
      uVar8 = -(int)((long)*(undefined8 *)(pGVar2 + uVar8) >> 0x3f);
      uVar7 = 0;
      if (uVar6 == uVar8) {
        uVar7 = (ulong)(uVar5 != uVar10) << 0x3f;
      }
      uVar9 = 0x8000000000000000;
      if (uVar4 == uVar11) {
        uVar9 = uVar7;
      }
      if (uVar6 == uVar8) {
        uVar9 = uVar7;
      }
      uVar9 = uVar1 & 0x7fffffff7fffffff | uVar9;
      goto LAB_0073d7b2;
    }
    uVar5 = uVar5 ^ uVar10;
    uVar4 = uVar4 ^ uVar11;
    uVar7 = uVar1 & 0x7fffffff7fffffff;
    if (((int)uVar8 < 0) ||
       (((int)uVar9 == 0x1fffffff || ((uVar6 & 0x1fffffff) <= (uVar8 & 0x1fffffff))))) {
      uVar4 = uVar4 & uVar5;
    }
    else {
      uVar4 = uVar4 ^ uVar5;
    }
    uVar9 = (ulong)uVar4 << 0x3f;
  }
  uVar9 = uVar9 | uVar7;
LAB_0073d7b2:
  *(ulong *)pObj = uVar9;
  return;
}

Assistant:

void Gia_ObjSetPhase( Gia_Man_t * p, Gia_Obj_t * pObj )  
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fPhase0 = Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj);
        int fPhase1 = Gia_ObjPhase(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(pObj);
        if ( Gia_ObjIsMux(p, pObj) )
        {
            int fPhase2 = Gia_ObjPhase(Gia_ObjFanin2(p, pObj)) ^ Gia_ObjFaninC2(p, pObj);
            pObj->fPhase = (fPhase2 && fPhase1) || (!fPhase2 && fPhase0);
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->fPhase = fPhase0 ^ fPhase1;
        else
            pObj->fPhase = fPhase0 & fPhase1;
    }
    else if ( Gia_ObjIsCo(pObj) )
        pObj->fPhase = (Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj));
    else
        pObj->fPhase = 0;
}